

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O0

void __thiscall
slang::ast::WaitOrderStatement::serializeTo(WaitOrderStatement *this,ASTSerializer *serializer)

{
  Expression *__n;
  string_view name;
  bool bVar1;
  reference ppEVar2;
  ASTSerializer *in_RSI;
  size_t in_RDI;
  Expression *ev;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range2;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_stack_ffffffffffffff68;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  *in_stack_ffffffffffffff70;
  ASTSerializer *this_00;
  ASTSerializer *in_stack_ffffffffffffff78;
  int __fd;
  char *in_stack_ffffffffffffff90;
  void *local_68;
  int local_60;
  void *local_58;
  int local_50;
  void *local_48;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_30;
  long local_28;
  ASTSerializer *local_10;
  
  local_10 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI,
             (char *)in_stack_ffffffffffffff78);
  name._M_str = in_stack_ffffffffffffff90;
  name._M_len = in_RDI;
  ASTSerializer::startArray(in_RSI,name);
  local_28 = in_RDI + 0x20;
  local_30._M_current =
       (Expression **)
       std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                 (in_stack_ffffffffffffff68);
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
            ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
             in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                      (in_stack_ffffffffffffff70,
                       (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff68);
    __fd = (int)in_stack_ffffffffffffff90;
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppEVar2 = __gnu_cxx::
              __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
              ::operator*(&local_30);
    __n = *ppEVar2;
    ASTSerializer::startObject((ASTSerializer *)0x88288b);
    in_stack_ffffffffffffff78 = local_10;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI,(char *)local_10);
    ASTSerializer::write(in_stack_ffffffffffffff78,local_50,local_48,(size_t)__n);
    ASTSerializer::endObject((ASTSerializer *)0x8828cf);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
    ::operator++(&local_30);
  }
  ASTSerializer::endArray((ASTSerializer *)0x8828eb);
  if (*(long *)(in_RDI + 0x30) != 0) {
    this_00 = local_10;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI,
               (char *)in_stack_ffffffffffffff78);
    ASTSerializer::write(this_00,local_60,local_58,*(size_t *)(in_RDI + 0x30));
  }
  if (*(long *)(in_RDI + 0x38) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI,
               (char *)in_stack_ffffffffffffff78);
    ASTSerializer::write(local_10,__fd,local_68,*(size_t *)(in_RDI + 0x38));
  }
  return;
}

Assistant:

void WaitOrderStatement::serializeTo(ASTSerializer& serializer) const {
    serializer.startArray("events");
    for (auto ev : events) {
        serializer.startObject();
        serializer.write("target", *ev);
        serializer.endObject();
    }
    serializer.endArray();

    if (ifTrue)
        serializer.write("ifTrue", *ifTrue);
    if (ifFalse)
        serializer.write("ifFalse", *ifFalse);
}